

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opener_file_system.cpp
# Opt level: O2

void __thiscall
duckdb::OpenerFileSystem::VerifyCanAccessFileInternal
          (OpenerFileSystem *this,string *path,FileType type)

{
  bool bVar1;
  int iVar2;
  undefined4 extraout_var;
  FileOpener *pFVar3;
  undefined4 extraout_var_00;
  DatabaseInstance *pDVar4;
  PermissionException *this_00;
  char *params;
  allocator local_69;
  optional_ptr<duckdb::DatabaseInstance,_true> db;
  optional_ptr<duckdb::FileOpener,_true> opener;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  string local_38;
  
  iVar2 = (*(this->super_FileSystem)._vptr_FileSystem[0x2c])();
  opener.ptr = (FileOpener *)CONCAT44(extraout_var,iVar2);
  if (opener.ptr != (FileOpener *)0x0) {
    pFVar3 = optional_ptr<duckdb::FileOpener,_true>::operator->(&opener);
    iVar2 = (*pFVar3->_vptr_FileOpener[5])(pFVar3);
    db.ptr = (DatabaseInstance *)CONCAT44(extraout_var_00,iVar2);
    if (db.ptr != (DatabaseInstance *)0x0) {
      pDVar4 = optional_ptr<duckdb::DatabaseInstance,_true>::operator->(&db);
      bVar1 = DBConfig::CanAccessFile(&pDVar4->config,path,type);
      if (!bVar1) {
        this_00 = (PermissionException *)__cxa_allocate_exception(0x10);
        ::std::__cxx11::string::string
                  ((string *)&local_38,
                   "Cannot access %s \"%s\" - file system operations are disabled by configuration",
                   &local_69);
        ::std::__cxx11::string::string((string *)&local_58,(string *)path);
        params = "file";
        if (type == FILE_TYPE_DIR) {
          params = "directory";
        }
        PermissionException::PermissionException<char_const*,std::__cxx11::string>
                  (this_00,&local_38,params,&local_58);
        __cxa_throw(this_00,&PermissionException::typeinfo,::std::runtime_error::~runtime_error);
      }
    }
  }
  return;
}

Assistant:

void OpenerFileSystem::VerifyCanAccessFileInternal(const string &path, FileType type) {
	auto opener = GetOpener();
	if (!opener) {
		return;
	}
	auto db = opener->TryGetDatabase();
	if (!db) {
		return;
	}
	auto &config = db->config;
	if (!config.CanAccessFile(path, type)) {
		throw PermissionException("Cannot access %s \"%s\" - file system operations are disabled by configuration",
		                          type == FileType::FILE_TYPE_DIR ? "directory" : "file", path);
	}
}